

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_null.c
# Opt level: O2

int main(void)

{
  int iVar1;
  uint uVar2;
  undefined8 uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar3 = json_object_new_string_len(" ",3);
  pcVar4 = (char *)json_object_to_json_string(uVar3);
  iVar1 = strcmp("\" \\u0000 \"",pcVar4);
  if (iVar1 == 0) {
    printf("JSON write result is correct: %s\n",pcVar4);
    pcVar4 = "PASS";
  }
  else {
    puts("JSON write result doesn\'t match expected string");
    printf("expected string: ");
    puts("\" \\u0000 \"");
    printf("parsed string:   ");
    puts(pcVar4);
    pcVar4 = "FAIL";
  }
  puts(pcVar4);
  json_object_put(uVar3);
  lVar5 = json_tokener_parse("\" \\u0000 \"");
  if (lVar5 == 0) {
    puts("ERROR: failed to parse");
  }
  else {
    uVar2 = json_object_get_string_len(lVar5);
    lVar6 = json_object_get_string(lVar5);
    printf("Re-parsed object string len=%d, chars=[",(ulong)uVar2);
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar7 = 0; uVar2 != uVar7; uVar7 = uVar7 + 1) {
      pcVar4 = ", ";
      if (uVar7 == 0) {
        pcVar4 = "";
      }
      printf("%s%d",pcVar4,(ulong)(uint)(int)*(char *)(lVar6 + uVar7));
    }
    puts("]");
    json_object_put(lVar5);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

int main(void)
{
	/* this test has a space after the null character. check that it's still included */
	const char *input = " \0 ";
	const char *expected = "\" \\u0000 \"";
	struct json_object *string = json_object_new_string_len(input, 3);
	const char *json = json_object_to_json_string(string);

	int strings_match = !strcmp(expected, json);
	int retval = 0;
	if (strings_match)
	{
		printf("JSON write result is correct: %s\n", json);
		puts("PASS");
	}
	else
	{
		puts("JSON write result doesn't match expected string");
		printf("expected string: ");
		puts(expected);
		printf("parsed string:   ");
		puts(json);
		puts("FAIL");
		retval = 1;
	}
	json_object_put(string);

	struct json_object *parsed_str = json_tokener_parse(expected);
	if (parsed_str)
	{
		int parsed_len = json_object_get_string_len(parsed_str);
		const char *parsed_cstr = json_object_get_string(parsed_str);
		int ii;
		printf("Re-parsed object string len=%d, chars=[", parsed_len);
		for (ii = 0; ii < parsed_len; ii++)
		{
			printf("%s%d", (ii ? ", " : ""), (int)parsed_cstr[ii]);
		}
		puts("]");
		json_object_put(parsed_str);
	}
	else
	{
		puts("ERROR: failed to parse");
	}
	return retval;
}